

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_scan_version_directive_number
              (yaml_parser_t *parser,yaml_mark_t start_mark,int *number)

{
  byte bVar1;
  size_t *psVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  size_t sVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  
  if ((parser->unread != 0) || (iVar4 = yaml_parser_update_buffer(parser,1), iVar4 != 0)) {
    pbVar6 = (parser->buffer).pointer;
    bVar9 = *pbVar6;
    bVar1 = bVar9 - 0x3a;
    if (0xf5 < bVar1) {
      iVar4 = 0;
      lVar10 = 10;
      do {
        lVar10 = lVar10 + -1;
        if (lVar10 == 0) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a %YAML directive";
          (parser->context_mark).index = start_mark.index;
          (parser->context_mark).line = start_mark.line;
          (parser->context_mark).column = start_mark.column;
          parser->problem = "found extremely long version number";
          sVar7 = (parser->mark).line;
          (parser->problem_mark).index = (parser->mark).index;
          (parser->problem_mark).line = sVar7;
          sVar7 = (parser->mark).column;
          goto LAB_0010e9ec;
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        sVar7 = parser->unread - 1;
        parser->unread = sVar7;
        bVar3 = *pbVar6;
        lVar8 = 1;
        if ((((char)bVar3 < '\0') && (lVar8 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (lVar8 = 3, (bVar3 & 0xf0) != 0xe0)) {
          lVar8 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
        }
        pbVar6 = pbVar6 + lVar8;
        (parser->buffer).pointer = pbVar6;
        if (sVar7 == 0) {
          iVar5 = yaml_parser_update_buffer(parser,1);
          if (iVar5 == 0) {
            return 0;
          }
          pbVar6 = (parser->buffer).pointer;
        }
        iVar4 = (uint)bVar9 + iVar4 * 10 + -0x30;
        bVar9 = *pbVar6;
      } while ((byte)(bVar9 - 0x30) < 10);
      if (0xf5 < bVar1) {
        *number = iVar4;
        return 1;
      }
    }
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a %YAML directive";
    (parser->context_mark).index = start_mark.index;
    (parser->context_mark).line = start_mark.line;
    (parser->context_mark).column = start_mark.column;
    parser->problem = "did not find expected version number";
    sVar7 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar7;
    sVar7 = (parser->mark).column;
LAB_0010e9ec:
    (parser->problem_mark).column = sVar7;
  }
  return 0;
}

Assistant:

static int
yaml_parser_scan_version_directive_number(yaml_parser_t *parser,
        yaml_mark_t start_mark, int *number)
{
    int value = 0;
    size_t length = 0;

    /* Repeat while the next character is digit. */

    if (!CACHE(parser, 1)) return 0;

    while (IS_DIGIT(parser->buffer))
    {
        /* Check if the number is too long. */

        if (++length > MAX_NUMBER_LENGTH) {
            return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                    start_mark, "found extremely long version number");
        }

        value = value*10 + AS_DIGIT(parser->buffer);

        SKIP(parser);

        if (!CACHE(parser, 1)) return 0;
    }

    /* Check if the number was present. */

    if (!length) {
        return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                start_mark, "did not find expected version number");
    }

    *number = value;

    return 1;
}